

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O2

Cluster * __thiscall amrex::Cluster::chop(Cluster *this)

{
  int n;
  int iVar1;
  int *piVar2;
  ulong uVar3;
  IntVect *a;
  Cluster *this_00;
  ulong uVar4;
  int minlen;
  CutStatus CVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  Vector<int,_std::allocator<int>_> *this_01;
  bool bVar9;
  IntVect IVar10;
  Cut __pred;
  IntVect cut;
  CutStatus status [3];
  Array<Vector<int>,_3> hist;
  
  IVar10 = Box::size(&this->m_bx);
  this_01 = hist._M_elems;
  hist._M_elems[2].super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  hist._M_elems[2].super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  hist._M_elems[1].super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  hist._M_elems[1].super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  hist._M_elems[0].super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  hist._M_elems[1].super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  hist._M_elems[0].super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  hist._M_elems[0].super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  hist._M_elems[2].super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  status[0] = HoleCut;
  std::vector<int,_std::allocator<int>_>::resize
            (&this_01->super_vector<int,_std::allocator<int>_>,(long)IVar10.vect[0],
             (value_type_conflict *)status);
  status[0] = HoleCut;
  std::vector<int,_std::allocator<int>_>::resize
            (&hist._M_elems[1].super_vector<int,_std::allocator<int>_>,IVar10.vect._0_8_ >> 0x20,
             (value_type_conflict *)status);
  status[0] = HoleCut;
  std::vector<int,_std::allocator<int>_>::resize
            (&hist._M_elems[2].super_vector<int,_std::allocator<int>_>,(long)IVar10.vect[2],
             (value_type_conflict *)status);
  lVar8 = 0;
  if (0 < this->m_len) {
    lVar8 = this->m_len;
  }
  piVar2 = this->m_ar->vect + 2;
  while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
    hist._M_elems[0].super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [(long)((IntVect *)(piVar2 + -2))->vect[0] - (long)(this->m_bx).smallend.vect[0]] =
         hist._M_elems[0].super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         [(long)((IntVect *)(piVar2 + -2))->vect[0] - (long)(this->m_bx).smallend.vect[0]] + 1;
    hist._M_elems[1].super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [(long)piVar2[-1] - (long)(this->m_bx).smallend.vect[1]] =
         hist._M_elems[1].super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         [(long)piVar2[-1] - (long)(this->m_bx).smallend.vect[1]] + 1;
    hist._M_elems[2].super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [(long)*piVar2 - (long)(this->m_bx).smallend.vect[2]] =
         hist._M_elems[2].super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         [(long)*piVar2 - (long)(this->m_bx).smallend.vect[2]] + 1;
    piVar2 = piVar2 + 3;
  }
  cut.vect[0] = 0;
  cut.vect[1] = 0;
  cut.vect[2] = 0;
  CVar5 = InvalidCut;
  for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
    iVar1 = FindCut((this_01->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,*(int *)((long)(this->m_bx).smallend.vect + lVar8),
                    *(int *)((long)(this->m_bx).bigend.vect + lVar8),
                    (CutStatus *)((long)status + lVar8));
    *(int *)((long)cut.vect + lVar8) = iVar1;
    if ((int)*(CutStatus *)((long)status + lVar8) < (int)CVar5) {
      CVar5 = *(CutStatus *)((long)status + lVar8);
    }
    this_01 = this_01 + 1;
  }
  uVar4 = 0xffffffffffffffff;
  iVar1 = -1;
  for (uVar3 = 0; uVar3 != 3; uVar3 = uVar3 + 1) {
    if (status[uVar3] == CVar5) {
      iVar7 = (this->m_bx).bigend.vect[uVar3] - cut.vect[uVar3];
      iVar6 = cut.vect[uVar3] - (this->m_bx).smallend.vect[uVar3];
      if (iVar6 <= iVar7) {
        iVar7 = iVar6;
      }
      if (iVar1 <= iVar7) {
        uVar4 = uVar3;
      }
      uVar4 = uVar4 & 0xffffffff;
      if (iVar1 < iVar7) {
        iVar1 = iVar7;
      }
    }
  }
  iVar1 = (int)uVar4;
  iVar7 = 0;
  for (lVar8 = 0; (this->m_bx).smallend.vect[iVar1] + lVar8 < (long)cut.vect[iVar1];
      lVar8 = lVar8 + 1) {
    iVar7 = iVar7 + *(int *)((long)hist._M_elems[iVar1].super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar8 * 4);
  }
  lVar8 = this->m_len;
  __pred._8_8_ = uVar4 << 0x20 | (ulong)(uint)cut.vect[2];
  __pred.m_cut.vect[0] = cut.vect[0];
  __pred.m_cut.vect[1] = cut.vect[1];
  a = std::partition<amrex::IntVect*,amrex::(anonymous_namespace)::Cut>
                (this->m_ar,this->m_ar + lVar8,__pred);
  this->m_len = (long)iVar7;
  minBox(this);
  this_00 = (Cluster *)operator_new(0x30);
  Cluster(this_00,a,(long)((int)lVar8 - iVar7));
  std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::~array(&hist);
  return this_00;
}

Assistant:

Cluster*
Cluster::chop ()
{
    BL_ASSERT(m_len > 1);
    BL_ASSERT(!(m_ar == 0));

    const int*    lo  = m_bx.loVect();
    const int*    hi  = m_bx.hiVect();
    const IntVect len = m_bx.size();
    //
    // Compute histogram.
    //
    Array<Vector<int>,AMREX_SPACEDIM> hist;
    AMREX_D_TERM(hist[0].resize(len[0], 0);,
                 hist[1].resize(len[1], 0);,
                 hist[2].resize(len[2], 0);)
    for (int n = 0; n < m_len; n++)
    {
        const int* p = m_ar[n].getVect();
        AMREX_D_TERM( hist[0][p[0]-lo[0]]++;,
                hist[1][p[1]-lo[1]]++;,
                hist[2][p[2]-lo[2]]++; )
     }
    //
    // Find cutpoint and cutstatus in each index direction.
    //
    CutStatus mincut = InvalidCut;
    CutStatus status[AMREX_SPACEDIM];
    IntVect cut;
    for (int n = 0; n < AMREX_SPACEDIM; n++)
    {
        cut[n] = FindCut(hist[n].data(), lo[n], hi[n], status[n]);
        if (status[n] < mincut)
        {
            mincut = status[n];
        }
    }
    BL_ASSERT(mincut != InvalidCut);
    //
    // Select best cutpoint and direction.
    //
    int dir = -1;
    for (int n = 0, minlen = -1; n < AMREX_SPACEDIM; n++)
    {
        if (status[n] == mincut)
        {
            int mincutlen = std::min(cut[n]-lo[n],hi[n]-cut[n]);
            if (mincutlen >= minlen)
            {
                dir = n;
                minlen = mincutlen;
            }
        }
    }
    BL_ASSERT(dir >= 0 && dir < AMREX_SPACEDIM);

    int nlo = 0;
    for (int i = lo[dir]; i < cut[dir]; i++) {
        nlo += hist[dir][i-lo[dir]];
    }

    BL_ASSERT(nlo > 0 && nlo < m_len);

    int nhi = m_len - nlo;

    IntVect* prt_it = std::partition(m_ar, m_ar+m_len, Cut(cut,dir));

    BL_ASSERT((prt_it-m_ar) == nlo);
    BL_ASSERT(((m_ar+m_len)-prt_it) == nhi);

    m_len = nlo;
    minBox();

    return new Cluster(prt_it, nhi);
}